

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error processInternalParamEntity(XML_Parser parser,ENTITY *entity)

{
  XML_Error XVar1;
  undefined8 local_58;
  OPEN_INTERNAL_ENTITY openEntity;
  XML_Error result;
  int tok;
  char *next;
  char *end;
  char *s;
  ENTITY *entity_local;
  XML_Parser parser_local;
  
  entity->open = '\x01';
  openEntity.internalEventEndPtr = *(char **)((long)parser + 0x230);
  *(undefined8 **)((long)parser + 0x230) = &local_58;
  local_58 = 0;
  openEntity.internalEventPtr = (char *)0x0;
  end = entity->textPtr;
  next = entity->textPtr + entity->textLen;
  openEntity.next = (open_internal_entity *)entity;
  s = (char *)entity;
  entity_local = (ENTITY *)parser;
  openEntity.entity._4_4_ =
       (*(code *)**(undefined8 **)((long)parser + 0x1b8))
                 (*(undefined8 *)((long)parser + 0x1b8),end,next,&result);
  XVar1 = doProlog(entity_local,*(ENCODING **)&entity_local[6].open,end,next,openEntity.entity._4_4_
                   ,_result,(char **)0x0);
  s[0x38] = '\0';
  entity_local[8].notation = openEntity.internalEventEndPtr;
  return XVar1;
}

Assistant:

static enum XML_Error
processInternalParamEntity(XML_Parser parser, ENTITY *entity)
{
  const char *s, *end, *next;
  int tok;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY openEntity;
  entity->open = 1;
  openEntity.next = openInternalEntities;
  openInternalEntities = &openEntity;
  openEntity.entity = entity;
  openEntity.internalEventPtr = 0;
  openEntity.internalEventEndPtr = 0;
  s = (char *)entity->textPtr;
  end = (char *)(entity->textPtr + entity->textLen);
  tok = XmlPrologTok(internalEncoding, s, end, &next);
  result = doProlog(parser, internalEncoding, s, end, tok, next, 0);
  entity->open = 0;
  openInternalEntities = openEntity.next;
  return result;
}